

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_bary2(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL t,REF_DBL *bary)

{
  uint uVar1;
  double dVar2;
  double local_90;
  double local_80;
  double local_78;
  double local_68;
  int local_5c;
  REF_INT i;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL total;
  double dStack_40;
  REF_INT sens;
  REF_DBL t1;
  REF_DBL t0;
  REF_DBL *bary_local;
  REF_DBL t_local;
  REF_INT *nodes_local;
  REF_GEOM ref_geom_local;
  
  t0 = (REF_DBL)bary;
  bary_local = (REF_DBL *)t;
  t_local = (REF_DBL)nodes;
  nodes_local = &ref_geom->n;
  uVar1 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,1,&t1,(REF_INT *)((long)&total + 4));
  if (uVar1 == 0) {
    uVar1 = ref_geom_cell_tuv((REF_GEOM)nodes_local,*(REF_INT *)((long)t_local + 4),
                              (REF_INT *)t_local,1,&stack0xffffffffffffffc0,
                              (REF_INT *)((long)&total + 4));
    if (uVar1 == 0) {
      *(double *)t0 = dStack_40 - (double)bary_local;
      *(double *)((long)t0 + 8) = (double)bary_local - t1;
      dVar2 = *(double *)t0 + *(double *)((long)t0 + 8);
      if (dVar2 * 1e+20 <= 0.0) {
        local_68 = -(dVar2 * 1e+20);
      }
      else {
        local_68 = dVar2 * 1e+20;
      }
      if (*(double *)t0 <= 0.0) {
        local_78 = -*(double *)t0;
      }
      else {
        local_78 = *(double *)t0;
      }
      if (local_78 < local_68) {
        if (dVar2 * 1e+20 <= 0.0) {
          local_80 = -(dVar2 * 1e+20);
        }
        else {
          local_80 = dVar2 * 1e+20;
        }
        if (*(double *)((long)t0 + 8) <= 0.0) {
          local_90 = -*(double *)((long)t0 + 8);
        }
        else {
          local_90 = *(double *)((long)t0 + 8);
        }
        if (local_90 < local_80) {
          *(double *)t0 = *(double *)t0 / dVar2;
          *(double *)((long)t0 + 8) = *(double *)((long)t0 + 8) / dVar2;
          return 0;
        }
      }
      printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e\n",dVar2,*(undefined8 *)t0,
             *(undefined8 *)((long)t0 + 8),
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf89,
             "ref_geom_bary2");
      for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
        *(undefined8 *)((long)t0 + (long)local_5c * 8) = 0;
      }
      ref_geom_local._4_4_ = 4;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf7b,
             "ref_geom_bary2",(ulong)uVar1,"uv1");
      ref_geom_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf79,
           "ref_geom_bary2",(ulong)uVar1,"uv0");
    ref_geom_local._4_4_ = uVar1;
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bary2(REF_GEOM ref_geom, REF_INT *nodes, REF_DBL t,
                                  REF_DBL *bary) {
  REF_DBL t0, t1;
  REF_INT sens;
  REF_DBL total;
  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &t0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &t1, &sens),
      "uv1");

  bary[0] = t1 - t;
  bary[1] = t - t0;

  total = bary[0] + bary[1];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total)) {
    bary[0] /= total;
    bary[1] /= total;
  } else {
    REF_INT i;
    printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e\n", __FILE__,
           __LINE__, __func__, total, bary[0], bary[1]);
    for (i = 0; i < 2; i++) bary[i] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}